

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5NextMethod(sqlite3_vtab_cursor *pCursor)

{
  long lVar1;
  long lVar2;
  sqlite3_vtab *psVar3;
  sqlite3_vtab *psVar4;
  sqlite3_module *psVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  iVar6 = *(int *)&pCursor[4].pVtab;
  if (iVar6 == 1) {
    if (*(int *)((long)&(pCursor->pVtab[1].pModule)->xUpdate + 4) != 0) {
      lVar8 = (long)*(int *)((long)&pCursor[8].pVtab[1].pModule + 4);
      if (0 < lVar8) {
        lVar1 = *(long *)&pCursor[8].pVtab[1].nRef;
        lVar10 = 0;
        do {
          lVar11 = *(long *)(lVar1 + lVar10 * 8) + 0x20;
          do {
            lVar2 = *(long *)(lVar11 + 0x18);
            if (((lVar2 != 0) && (*(long *)(lVar2 + 0x18) != 0)) &&
               ((*(int *)(lVar2 + 0x48) == 0 || (*(int *)(**(long **)(lVar2 + 0x20) + 0x74) != 0))))
            {
              *(undefined4 *)(*(long *)(lVar2 + 0x18) + 4) = 0;
            }
            lVar11 = *(long *)(lVar11 + 0x20);
          } while (lVar11 != 0);
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar8);
        goto LAB_001d868d;
      }
    }
  }
  else {
LAB_001d868d:
    if (2 < iVar6) {
      if (iVar6 == 4) {
        iVar6 = fts5SorterNext((Fts5Cursor *)pCursor);
        return iVar6;
      }
      if (iVar6 == 3) {
        *(byte *)&pCursor[10].pVtab = *(byte *)&pCursor[10].pVtab | 1;
      }
      else {
        psVar5 = pCursor->pVtab[1].pModule;
        *(int *)&psVar5->xShadowName = *(int *)&psVar5->xShadowName + 1;
        iVar6 = sqlite3_step((sqlite3_stmt *)pCursor[7].pVtab);
        *(int *)&psVar5->xShadowName = *(int *)&psVar5->xShadowName + -1;
        if (iVar6 == 100) {
          *(uint *)&pCursor[10].pVtab = *(uint *)&pCursor[10].pVtab | 4;
        }
        else {
          *(uint *)&pCursor[10].pVtab = *(uint *)&pCursor[10].pVtab | 1;
          iVar6 = sqlite3_reset((sqlite3_stmt *)pCursor[7].pVtab);
          if (iVar6 != 0) {
            pcVar7 = sqlite3_errmsg(*(sqlite3 **)psVar5);
            pcVar7 = sqlite3_mprintf("%s",pcVar7);
            pCursor->pVtab->zErrMsg = pcVar7;
            return iVar6;
          }
        }
      }
      return 0;
    }
  }
  bVar12 = false;
  iVar6 = 0;
  if (((ulong)pCursor[10].pVtab & 0x20) != 0) {
    lVar8 = ((Fts5Expr *)pCursor[8].pVtab)->pRoot->iRowid;
    iVar6 = sqlite3Fts5ExprFirst
                      ((Fts5Expr *)pCursor[8].pVtab,*(Fts5Index **)&pCursor->pVtab[1].nRef,lVar8,
                       *(int *)((long)&pCursor[4].pVtab + 4));
    bVar12 = false;
    pcVar7 = (pCursor[8].pVtab)->zErrMsg;
    if (iVar6 == 0) {
      bVar12 = lVar8 != *(long *)(pcVar7 + 0x18);
    }
    uVar9 = *(uint *)&pCursor[10].pVtab & 0xffffff91;
    *(uint *)&pCursor[10].pVtab = uVar9 + 0x4e;
    if (*(int *)(pcVar7 + 4) != 0) {
      *(uint *)&pCursor[10].pVtab = uVar9 | 0x4f;
      return iVar6;
    }
  }
  if (bVar12 || iVar6 != 0) {
    return iVar6;
  }
  psVar3 = pCursor[6].pVtab;
  psVar4 = pCursor[8].pVtab;
  pcVar7 = psVar4->zErrMsg;
  do {
    iVar6 = (**(code **)(pcVar7 + 0x10))(psVar4,pcVar7,0,0);
  } while (*(int *)(pcVar7 + 8) != 0);
  if (*(int *)&psVar4[1].pModule == 0) {
    if (*(long *)(pcVar7 + 0x18) <= (long)psVar3) goto LAB_001d873a;
  }
  else if ((long)psVar3 <= *(long *)(pcVar7 + 0x18)) goto LAB_001d873a;
  pcVar7[4] = '\x01';
  pcVar7[5] = '\0';
  pcVar7[6] = '\0';
  pcVar7[7] = '\0';
LAB_001d873a:
  *(uint *)&pCursor[10].pVtab =
       *(uint *)((pCursor[8].pVtab)->zErrMsg + 4) | *(uint *)&pCursor[10].pVtab | 0x4e;
  return iVar6;
}

Assistant:

static int fts5NextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int rc;

  assert( (pCsr->ePlan<3)==
          (pCsr->ePlan==FTS5_PLAN_MATCH || pCsr->ePlan==FTS5_PLAN_SOURCE)
  );
  assert( !CsrFlagTest(pCsr, FTS5CSR_EOF) );

  /* If this cursor uses FTS5_PLAN_MATCH and this is a tokendata=1 table,
  ** clear any token mappings accumulated at the fts5_index.c level. In
  ** other cases, specifically FTS5_PLAN_SOURCE and FTS5_PLAN_SORTED_MATCH,
  ** we need to retain the mappings for the entire query.  */
  if( pCsr->ePlan==FTS5_PLAN_MATCH
   && ((Fts5Table*)pCursor->pVtab)->pConfig->bTokendata
  ){
    sqlite3Fts5ExprClearTokens(pCsr->pExpr);
  }

  if( pCsr->ePlan<3 ){
    int bSkip = 0;
    if( (rc = fts5CursorReseek(pCsr, &bSkip)) || bSkip ) return rc;
    rc = sqlite3Fts5ExprNext(pCsr->pExpr, pCsr->iLastRowid);
    CsrFlagSet(pCsr, sqlite3Fts5ExprEof(pCsr->pExpr));
    fts5CsrNewrow(pCsr);
  }else{
    switch( pCsr->ePlan ){
      case FTS5_PLAN_SPECIAL: {
        CsrFlagSet(pCsr, FTS5CSR_EOF);
        rc = SQLITE_OK;
        break;
      }

      case FTS5_PLAN_SORTED_MATCH: {
        rc = fts5SorterNext(pCsr);
        break;
      }

      default: {
        Fts5Config *pConfig = ((Fts5Table*)pCursor->pVtab)->pConfig;
        pConfig->bLock++;
        rc = sqlite3_step(pCsr->pStmt);
        pConfig->bLock--;
        if( rc!=SQLITE_ROW ){
          CsrFlagSet(pCsr, FTS5CSR_EOF);
          rc = sqlite3_reset(pCsr->pStmt);
          if( rc!=SQLITE_OK ){
            pCursor->pVtab->zErrMsg = sqlite3_mprintf(
                "%s", sqlite3_errmsg(pConfig->db)
            );
          }
        }else{
          rc = SQLITE_OK;
          CsrFlagSet(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
        }
        break;
      }
    }
  }

  return rc;
}